

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O3

uint64_t __thiscall namedlabels::get(namedlabels *this,substring *s)

{
  unsigned_long uVar1;
  uint uVar2;
  unsigned_long *puVar3;
  ostream *poVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  char local_2a [2];
  
  uVar2 = (int)s->end - (int)s->begin;
  uVar6 = uVar2;
  if ((int)uVar2 < 0) {
    uVar6 = uVar2 + 3;
  }
  pbVar5 = (byte *)(s->begin + (int)(uVar6 & 0xfffffffc));
  uVar9 = 0x5c621;
  if (6 < uVar2 + 3) {
    lVar8 = (long)-((int)uVar6 >> 2);
    do {
      uVar9 = ((uint)(*(int *)(pbVar5 + lVar8 * 4) * -0x3361d2af) >> 0x11 |
              *(int *)(pbVar5 + lVar8 * 4) * 0x16a88000) * 0x1b873593 ^ uVar9;
      uVar9 = (uVar9 << 0xd | uVar9 >> 0x13) * 5 + 0xe6546b64;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
  }
  uVar7 = 0;
  uVar6 = 0;
  switch(uVar2 & 3) {
  case 3:
    uVar6 = (uint)pbVar5[2] << 0x10;
  case 2:
    uVar7 = uVar6 | (uint)pbVar5[1] << 8;
  case 1:
    uVar9 = uVar9 ^ ((*pbVar5 ^ uVar7) * -0x3361d2af >> 0x11 | (*pbVar5 ^ uVar7) * 0x16a88000) *
                    0x1b873593;
  case 0:
    uVar2 = ((uVar9 ^ uVar2) >> 0x10 ^ uVar9 ^ uVar2) * -0x7a143595;
    uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
    puVar3 = v_hashmap<substring,_unsigned_long>::get
                       (&this->name2id,s,(ulong)(uVar2 >> 0x10 ^ uVar2));
    uVar1 = *puVar3;
    if (uVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: missing named label \'",0x1e);
      pcVar10 = s->begin;
      if (pcVar10 != s->end) {
        do {
          local_2a[0] = *pcVar10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2a,1);
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 != s->end);
      }
      local_2a[1] = 0x27;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_2a + 1,1);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    return uVar1;
  }
}

Assistant:

uint64_t get(substring& s)
  {
    uint64_t hash = uniform_hash((unsigned char*)s.begin, s.end - s.begin, 378401);
    uint64_t v = name2id.get(s, hash);
    if (v == 0)
    {
      std::cerr << "warning: missing named label '";
      for (char* c = s.begin; c != s.end; c++) std::cerr << *c;
      std::cerr << '\'' << std::endl;
    }
    return v;
  }